

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalCSE.cpp
# Opt level: O3

void __thiscall wasm::anon_unknown_236::Checker::visitExpression(Checker *this,Expression *curr)

{
  unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  _Rb_tree_header *p_Var4;
  Type *pTVar5;
  __node_base_ptr p_Var6;
  Expression *pEVar7;
  PassOptions *pPVar8;
  Expression *__x;
  Expression *pEVar9;
  __node_ptr __n_00;
  anon_struct_8_0_00000001_for___align aVar10;
  key_type *__x_00;
  key_type *ppEVar11;
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_01;
  __node_ptr p_Var12;
  __node_ptr __n_01;
  _Hash_node_base *p_Var13;
  undefined1 *puVar14;
  uintptr_t uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *psVar18;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *psVar19;
  long lVar20;
  pointer ppEVar21;
  undefined4 uVar22;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var23;
  bool bVar24;
  mapped_type *pmVar25;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
  *this_02;
  _Base_ptr p_Var26;
  Type *__s;
  Type *pTVar27;
  __node_ptr __prev_n;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
  *p_Var28;
  _Rb_tree_color _Var29;
  ulong uVar30;
  ulong uVar31;
  size_type __n_02;
  ulong uVar32;
  __hash_code __code;
  _Base_ptr p_Var33;
  _Hash_node_base *p_Var34;
  __node_ptr __n;
  undefined1 auVar35 [8];
  __hash_code __code_1;
  long *plVar36;
  undefined1 auVar37 [16];
  undefined1 auStack_348 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> invalidated;
  FeatureSet FStack_328;
  bool local_324;
  bool local_323;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_320;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_2f0;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_2c0;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_290;
  bool local_260;
  bool bStack_25f;
  bool bStack_25e;
  bool bStack_25d;
  bool bStack_25c;
  bool bStack_25b;
  bool bStack_25a;
  bool bStack_259;
  bool bStack_258;
  bool bStack_257;
  bool bStack_256;
  bool bStack_255;
  undefined4 uStack_254;
  size_t local_250;
  size_t sStack_248;
  bool local_240;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_238;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_208;
  undefined1 local_1d0 [8];
  EffectAnalyzer effects;
  unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
  *__range3;
  Expression *local_40;
  Expression *original;
  
  uVar22 = local_1d0._0_4_;
  uVar31 = (this->activeOriginals)._M_h._M_bucket_count;
  uVar30 = (ulong)curr % uVar31;
  p_Var6 = (this->activeOriginals)._M_h._M_buckets[uVar30];
  if (p_Var6 != (__node_base_ptr)0x0) {
    p_Var34 = p_Var6->_M_nxt;
    pEVar7 = (Expression *)p_Var34[1]._M_nxt;
    do {
      if (pEVar7 == curr) {
        __assert_fail("!activeOriginals.count(curr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/LocalCSE.cpp"
                      ,0x178,
                      "void wasm::(anonymous namespace)::Checker::visitExpression(Expression *)");
      }
      p_Var34 = p_Var34->_M_nxt;
    } while ((p_Var34 != (_Hash_node_base *)0x0) &&
            (pEVar7 = (Expression *)p_Var34[1]._M_nxt, (ulong)pEVar7 % uVar31 == uVar30));
  }
  this_00 = &this->activeOriginals;
  original = (Expression *)this;
  if ((this->activeOriginals)._M_h._M_element_count != 0) {
    effects.funcEffectsMap.
    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (this->
         super_LinearExecutionWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
         ).
         super_PostWalker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
         .
         super_Walker<wasm::(anonymous_namespace)::Checker,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::Checker,_void>_>
         .currModule;
    pPVar8 = this->options;
    uVar16 = pPVar8->ignoreImplicitTraps;
    uVar17 = pPVar8->trapsNeverHappen;
    local_1d0[1] = uVar17;
    local_1d0[0] = uVar16;
    local_1d0._2_2_ = SUB42(uVar22,2);
    effects._0_8_ =
         (pPVar8->funcEffectsMap).
         super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    effects.funcEffectsMap.
    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              (pPVar8->funcEffectsMap).
              super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        effects.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        effects.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             effects.funcEffectsMap.
             super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        effects.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             effects.funcEffectsMap.
             super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_M_use_count + 1;
      }
    }
    effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&effects.localsRead;
    effects.module._0_4_ =
         (((Module *)
          effects.funcEffectsMap.
          super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi)->features).features;
    effects.module._4_2_ = 0;
    effects.localsRead._M_t._M_impl._0_4_ = 0;
    effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&effects.localsWritten;
    effects.localsWritten._M_t._M_impl._0_4_ = 0;
    effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&effects.mutableGlobalsRead;
    effects.mutableGlobalsRead._M_t._M_impl._0_4_ = 0;
    effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)0x0;
    effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&effects.globalsWritten;
    effects.globalsWritten._M_t._M_impl._0_4_ = 0;
    effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&effects.breakTargets;
    effects.breakTargets._M_t._M_impl._0_4_ = 0;
    effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    effects._232_8_ = effects._232_8_ & 0xffffffff00000000;
    effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    effects.trap = false;
    effects.implicitTrap = false;
    effects.isAtomic = false;
    effects.throws_ = false;
    effects._244_4_ = 0;
    effects.tryDepth = 0;
    effects.catchDepth = effects.catchDepth & 0xffffffffffffff00;
    effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&effects.delegateTargets;
    effects.delegateTargets._M_t._M_impl._0_4_ = 0;
    effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    EffectAnalyzer::visit((EffectAnalyzer *)local_1d0,curr);
    auStack_348 = (undefined1  [8])0x0;
    invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    plVar36 = (long *)original[0xf].type.id;
    if (plVar36 != (long *)0x0) {
      do {
        local_40 = (Expression *)plVar36[1];
        bVar24 = EffectAnalyzer::invalidates
                           ((EffectAnalyzer *)local_1d0,(EffectAnalyzer *)(plVar36 + 3));
        if (bVar24) {
          if (invalidated.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start ==
              invalidated.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
            _M_realloc_insert<wasm::Expression*const&>
                      ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_348,
                       (iterator)
                       invalidated.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,&local_40);
          }
          else {
            *invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
             ._M_impl.super__Vector_impl_data._M_start = local_40;
            invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 invalidated.
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_start + 1;
          }
        }
        pEVar7 = original;
        ppEVar21 = invalidated.
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        plVar36 = (long *)*plVar36;
      } while (plVar36 != (long *)0x0);
      if (auStack_348 !=
          (undefined1  [8])
          invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        auVar35 = auStack_348;
        do {
          __x = *(Expression **)auVar35;
          uVar31 = (ulong)__x % *(ulong *)(pEVar7 + 0xf);
          plVar36 = *(long **)(pEVar7[0xe].type.id + uVar31 * 8);
          local_40 = __x;
          if (plVar36 == (long *)0x0) {
LAB_00774e2e:
            std::__throw_out_of_range("_Map_base::at");
          }
          plVar36 = (long *)*plVar36;
          pEVar9 = (Expression *)plVar36[1];
          while (pEVar9 != __x) {
            plVar36 = (long *)*plVar36;
            if ((plVar36 == (long *)0x0) ||
               (pEVar9 = (Expression *)plVar36[1],
               (ulong)pEVar9 % *(ulong *)(pEVar7 + 0xf) != uVar31)) goto LAB_00774e2e;
          }
          lVar20 = plVar36[2];
          pmVar25 = std::
                    unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                    ::operator[](*(unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                                   **)(pEVar7 + 0xe),&local_40);
          pmVar25->requests = pmVar25->requests - (int)lVar20;
          pmVar25 = std::
                    unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                    ::operator[](*(unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                                   **)(pEVar7 + 0xe),&local_40);
          if (pmVar25->requests == 0) {
            std::
            unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
            ::erase(*(unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
                      **)(original + 0xe),(key_type *)__x);
          }
          std::
          unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
          ::erase(this_00,(key_type *)__x);
          auVar35 = (undefined1  [8])((long)auVar35 + 8);
        } while (auVar35 != (undefined1  [8])ppEVar21);
      }
      if (auStack_348 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_348,
                        (long)invalidated.
                              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_348);
      }
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&effects.danglingPop);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)&effects.features);
    if (effects.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 effects.funcEffectsMap.
                 super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
    }
  }
  uVar31 = (*(long **)(original + 0xe))[1];
  uVar30 = (ulong)curr % uVar31;
  plVar36 = *(long **)(**(long **)(original + 0xe) + uVar30 * 8);
  if (plVar36 == (long *)0x0) {
    return;
  }
  __n_00 = (__node_ptr)*plVar36;
  aVar10 = (__n_00->
           super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
           ).
           super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>
           ._M_storage._M_storage.__align;
  while (aVar10 != (anon_struct_8_0_00000001_for___align)curr) {
    __n_00 = (__node_ptr)(__n_00->super__Hash_node_base)._M_nxt;
    if (__n_00 == (__node_ptr)0x0) {
      return;
    }
    aVar10 = *(anon_struct_8_0_00000001_for___align *)
              &(__n_00->
               super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
               ).
               super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>
               ._M_storage._M_storage;
    if ((ulong)aVar10 % uVar31 != uVar30) {
      return;
    }
  }
  RequestInfo::validate
            ((RequestInfo *)
             (ulong)*(uint *)((long)&(__n_00->
                                     super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                                     ).
                                     super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>
                                     ._M_storage._M_storage + 8));
  if (*(int *)((long)&(__n_00->
                      super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>
                      ._M_storage._M_storage + 8) == 0) {
    __x_00 = *(key_type **)
              ((long)&(__n_00->
                      super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>
                      ._M_storage._M_storage + 0x10);
    if (__x_00 == (key_type *)0x0) {
      return;
    }
    uVar31 = (ulong)__x_00 % *(ulong *)(original + 0xf);
    plVar36 = *(long **)(original[0xe].type.id + uVar31 * 8);
    if (plVar36 != (long *)0x0) {
      plVar36 = (long *)*plVar36;
      ppEVar11 = (key_type *)plVar36[1];
      do {
        if (ppEVar11 == __x_00) {
          if ((int)plVar36[2] == 1) {
            std::
            unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>_>_>
            ::erase(this_00,__x_00);
            return;
          }
          *(int *)(plVar36 + 2) = (int)plVar36[2] + -1;
          return;
        }
        plVar36 = (long *)*plVar36;
      } while ((plVar36 != (long *)0x0) &&
              (ppEVar11 = (key_type *)plVar36[1],
              (ulong)ppEVar11 % *(ulong *)(original + 0xf) == uVar31));
    }
    this_01 = *(_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                **)(original + 0xe);
    uVar31 = *(ulong *)&(__n_00->
                        super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>
                        ._M_storage._M_storage % this_01->_M_bucket_count;
    p_Var12 = (__node_ptr)this_01->_M_buckets[uVar31];
    do {
      __prev_n = p_Var12;
      p_Var12 = (__node_ptr)(__prev_n->super__Hash_node_base)._M_nxt;
    } while (p_Var12 != __n_00);
    std::
    _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(this_01,uVar31,&__prev_n->super__Hash_node_base,__n_00);
    return;
  }
  EffectAnalyzer::EffectAnalyzer
            ((EffectAnalyzer *)auStack_348,(PassOptions *)original[0xd].type.id,
             *(Module **)(original + 0xd),curr);
  bStack_258 = false;
  if ((((((local_2f0._M_impl.super__Rb_tree_header._M_node_count != 0) || (local_240 != false)) ||
        (local_290._M_impl.super__Rb_tree_header._M_node_count != 0)) ||
       ((bStack_25f != false || (bStack_25d != false)))) ||
      ((bStack_25b != false || ((bStack_259 != false || (bStack_256 != false)))))) ||
     ((local_323 != false ||
      ((((bStack_255 != false || (local_208._M_impl.super__Rb_tree_header._M_node_count != 0)) ||
        (local_324 != false)) ||
       ((local_238._M_impl.super__Rb_tree_header._M_node_count != 0 ||
        (bVar24 = Properties::isGenerative
                            (curr,(FeatureSet)*(uint32_t *)(*(long *)(original + 0xd) + 0x108)),
        auVar35 = auStack_348, bVar24)))))))) {
    std::
    unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
    ::erase(*(unordered_map<wasm::Expression_*,_wasm::(anonymous_namespace)::RequestInfo,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>_>
              **)(original + 0xe),(key_type *)curr);
  }
  else {
    local_1d0._0_4_ =
         *(undefined4 *)
          ((long)&(__n_00->
                  super__Hash_node_value<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>,_false>
                  ).
                  super__Hash_node_value_base<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::RequestInfo>_>
                  ._M_storage._M_storage + 8);
    p_Var1 = &effects.localsRead._M_t._M_impl.super__Rb_tree_header;
    effects.ignoreImplicitTraps = (bool)auStack_348[0];
    effects.trapsNeverHappen = (bool)auStack_348[1];
    effects.funcEffectsMap.
    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              invalidated.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    effects.funcEffectsMap.
    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    effects.module._0_4_ =
         (uint32_t)
         invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._0_6_;
    effects.module._4_2_ =
         (undefined2)
         ((uint6)invalidated.
                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage._0_6_ >> 0x20);
    effects.module._6_2_ =
         invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._6_2_;
    effects._32_6_ = ZEXT46(FStack_328.features);
    if (local_320._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      psVar18 = &effects.localsRead;
      effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_320._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    else {
      p_Var2 = &local_320._M_impl.super__Rb_tree_header;
      effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_320._M_impl.super__Rb_tree_header._M_header._M_parent;
      (local_320._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
      psVar18 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                &local_320;
      effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_320._M_impl.super__Rb_tree_header._M_node_count;
      local_320._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_320._M_impl.super__Rb_tree_header._M_header._M_left;
      effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_320._M_impl.super__Rb_tree_header._M_header._M_right;
      local_320._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
      local_320._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    }
    p_Var2 = &effects.localsWritten._M_t._M_impl.super__Rb_tree_header;
    (psVar18->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_320._M_impl.super__Rb_tree_header._M_header._M_color;
    if (local_2f0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      psVar18 = &effects.localsWritten;
      effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_2f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var2->_M_header;
      effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var2->_M_header;
    }
    else {
      psVar18 = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                &local_2f0;
      p_Var3 = &local_2f0._M_impl.super__Rb_tree_header;
      effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_2f0._M_impl.super__Rb_tree_header._M_header._M_parent;
      (local_2f0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var2->_M_header;
      effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_2f0._M_impl.super__Rb_tree_header._M_node_count;
      local_2f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_2f0._M_impl.super__Rb_tree_header._M_header._M_left;
      effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_2f0._M_impl.super__Rb_tree_header._M_header._M_right;
      local_2f0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
      local_2f0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    }
    effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header;
    (psVar18->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_2f0._M_impl.super__Rb_tree_header._M_header._M_color;
    if (local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      psVar19 = &effects.mutableGlobalsRead;
      effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_2c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      p_Var3 = &local_2c0._M_impl.super__Rb_tree_header;
      effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent;
      (local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      psVar19 = (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&local_2c0;
      effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_2c0._M_impl.super__Rb_tree_header._M_node_count;
      local_2c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_2c0._M_impl.super__Rb_tree_header._M_header._M_left;
      effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_2c0._M_impl.super__Rb_tree_header._M_header._M_right;
      local_2c0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
      local_2c0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    }
    effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header;
    (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_2c0._M_impl.super__Rb_tree_header._M_header._M_color;
    if (local_290._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      psVar19 = &effects.globalsWritten;
      effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
      ;
      local_290._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      psVar19 = (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&local_290;
      p_Var3 = &local_290._M_impl.super__Rb_tree_header;
      effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_290._M_impl.super__Rb_tree_header._M_header._M_parent;
      (local_290._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_290._M_impl.super__Rb_tree_header._M_node_count;
      local_290._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_290._M_impl.super__Rb_tree_header._M_header._M_left;
      effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_290._M_impl.super__Rb_tree_header._M_header._M_right;
      local_290._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
      local_290._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    }
    p_Var3 = &effects.breakTargets._M_t._M_impl.super__Rb_tree_header;
    (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_290._M_impl.super__Rb_tree_header._M_header._M_color;
    effects.writesMemory = bStack_25f;
    effects.readsMemory = local_260;
    effects.readsTable = bStack_25e;
    effects.writesTable = bStack_25d;
    effects.readsMutableStruct = bStack_25c;
    effects.writesStruct = bStack_25b;
    effects.readsArray = bStack_25a;
    effects.writesArray = bStack_259;
    effects.implicitTrap = bStack_257;
    effects.trap = bStack_258;
    effects.isAtomic = bStack_256;
    effects.throws_ = bStack_255;
    effects._244_4_ = uStack_254;
    effects.tryDepth = local_250;
    effects.catchDepth = sStack_248;
    effects.danglingPop = local_240;
    if (local_238._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      psVar19 = &effects.breakTargets;
      effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_238._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header
      ;
      effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var3->_M_header;
    }
    else {
      psVar19 = (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&local_238;
      p_Var4 = &local_238._M_impl.super__Rb_tree_header;
      effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_238._M_impl.super__Rb_tree_header._M_header._M_parent;
      (local_238._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var3->_M_header;
      effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_238._M_impl.super__Rb_tree_header._M_node_count;
      local_238._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_238._M_impl.super__Rb_tree_header._M_header._M_left;
      effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_238._M_impl.super__Rb_tree_header._M_header._M_right;
      local_238._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
      local_238._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
    }
    effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header;
    (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_238._M_impl.super__Rb_tree_header._M_header._M_color;
    if (local_208._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
      psVar19 = &effects.delegateTargets;
      effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_208._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      psVar19 = (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)&local_208;
      p_Var4 = &local_208._M_impl.super__Rb_tree_header;
      effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_208._M_impl.super__Rb_tree_header._M_header._M_parent;
      (local_208._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_208._M_impl.super__Rb_tree_header._M_node_count;
      local_208._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_208._M_impl.super__Rb_tree_header._M_header._M_left;
      effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_208._M_impl.super__Rb_tree_header._M_header._M_right;
      local_208._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
      local_208._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
    }
    (psVar19->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_208._M_impl.super__Rb_tree_header._M_header._M_color;
    auStack_348 = auVar35;
    this_02 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
               *)operator_new(0x188);
    _Var23 = effects.funcEffectsMap.
             super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount;
    _Var29 = _S_red;
    *(undefined8 *)&this_02->field_0x0 = 0;
    *(Expression **)(this_02 + 8) = curr;
    *(undefined4 *)(this_02 + 0x10) = local_1d0._0_4_;
    *(undefined2 *)(this_02 + 0x18) = effects._0_2_;
    effects.funcEffectsMap.
    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(element_type **)(this_02 + 0x20) =
         effects.funcEffectsMap.
         super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_02 + 0x28) = _Var23._M_pi;
    effects.funcEffectsMap.
    super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    *(ulong *)(this_02 + 0x30 + 6) = CONCAT62(effects._32_6_,effects.module._6_2_);
    *(ulong *)(this_02 + 0x30) =
         CONCAT26(effects.module._6_2_,CONCAT24(effects.module._4_2_,(uint32_t)effects.module));
    p_Var26 = (_Base_ptr)(this_02 + 0x48);
    if (effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
    {
      *(undefined8 *)(this_02 + 0x50) = 0;
      p_Var28 = this_02 + 0x68;
      p_Var33 = p_Var26;
    }
    else {
      p_Var28 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                 *)&effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *(_Base_ptr *)(this_02 + 0x50) =
           effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           p_Var26;
      *(size_t *)(this_02 + 0x68) =
           effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count;
      effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      p_Var26 = effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var33 = effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      _Var29 = effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      effects.localsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    *(_Base_ptr *)(this_02 + 0x58) = p_Var26;
    *(_Base_ptr *)(this_02 + 0x60) = p_Var33;
    *(undefined8 *)p_Var28 = 0;
    *(_Rb_tree_color *)(this_02 + 0x48) = _Var29;
    p_Var26 = (_Base_ptr)(this_02 + 0x78);
    if (effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)0x0) {
      *(undefined8 *)(this_02 + 0x80) = 0;
      p_Var28 = this_02 + 0x98;
      _Var29 = _S_red;
      p_Var33 = p_Var26;
    }
    else {
      p_Var28 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                 *)&effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *(_Base_ptr *)(this_02 + 0x80) =
           effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           p_Var26;
      *(size_t *)(this_02 + 0x98) =
           effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count;
      effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      p_Var26 = effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var33 = effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      _Var29 = effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var2->_M_header;
      effects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var2->_M_header;
    }
    *(_Base_ptr *)(this_02 + 0x88) = p_Var26;
    *(_Base_ptr *)(this_02 + 0x90) = p_Var33;
    *(undefined8 *)p_Var28 = 0;
    *(_Rb_tree_color *)(this_02 + 0x78) = _Var29;
    p_Var26 = (_Base_ptr)(this_02 + 0xa8);
    if (effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)0x0) {
      *(undefined8 *)(this_02 + 0xb0) = 0;
      p_Var28 = this_02 + 200;
      _Var29 = _S_red;
      p_Var33 = p_Var26;
    }
    else {
      p_Var28 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                 *)&effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *(_Base_ptr *)(this_02 + 0xb0) =
           effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent
           = p_Var26;
      *(size_t *)(this_02 + 200) =
           effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_node_count;
      effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      p_Var1 = &effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header;
      p_Var26 = effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var33 = effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      _Var29 = effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      effects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
    }
    *(_Base_ptr *)(this_02 + 0xb8) = p_Var26;
    *(_Base_ptr *)(this_02 + 0xc0) = p_Var33;
    *(undefined8 *)p_Var28 = 0;
    *(_Rb_tree_color *)(this_02 + 0xa8) = _Var29;
    p_Var26 = (_Base_ptr)(this_02 + 0xd8);
    if (effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)0x0) {
      *(undefined8 *)(this_02 + 0xe0) = 0;
      p_Var28 = this_02 + 0xf8;
      _Var29 = _S_red;
      p_Var33 = p_Var26;
    }
    else {
      p_Var28 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                 *)&effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *(_Base_ptr *)(this_02 + 0xe0) =
           effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           p_Var26;
      *(size_t *)(this_02 + 0xf8) =
           effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count;
      effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
      ;
      p_Var1 = &effects.globalsWritten._M_t._M_impl.super__Rb_tree_header;
      p_Var26 = effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var33 = effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      _Var29 = effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      effects.globalsWritten._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
    }
    *(_Base_ptr *)(this_02 + 0xe8) = p_Var26;
    *(_Base_ptr *)(this_02 + 0xf0) = p_Var33;
    *(undefined8 *)p_Var28 = 0;
    *(_Rb_tree_color *)(this_02 + 0xd8) = _Var29;
    this_02[0x120] =
         (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
          )effects.danglingPop;
    *(size_t *)(this_02 + 0x110) = effects.tryDepth;
    *(size_t *)(this_02 + 0x118) = effects.catchDepth;
    *(undefined8 *)(this_02 + 0x100) = effects._232_8_;
    *(undefined8 *)(this_02 + 0x108) = effects._240_8_;
    p_Var26 = (_Base_ptr)(this_02 + 0x130);
    if (effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)0x0) {
      *(undefined8 *)(this_02 + 0x138) = 0;
      p_Var28 = this_02 + 0x150;
      _Var29 = _S_red;
      p_Var33 = p_Var26;
    }
    else {
      p_Var28 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                 *)&effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *(_Base_ptr *)(this_02 + 0x138) =
           effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           p_Var26;
      *(size_t *)(this_02 + 0x150) =
           effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
      effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      p_Var26 = effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var33 = effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      _Var29 = effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header
      ;
      effects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var3->_M_header;
    }
    *(_Base_ptr *)(this_02 + 0x140) = p_Var26;
    *(_Base_ptr *)(this_02 + 0x148) = p_Var33;
    *(undefined8 *)p_Var28 = 0;
    *(_Rb_tree_color *)(this_02 + 0x130) = _Var29;
    p_Var26 = (_Base_ptr)(this_02 + 0x160);
    if (effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
        (_Base_ptr)0x0) {
      *(undefined8 *)(this_02 + 0x168) = 0;
      p_Var28 = this_02 + 0x180;
      _Var29 = _S_red;
      p_Var33 = p_Var26;
    }
    else {
      p_Var28 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
                 *)&effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
      *(_Base_ptr *)(this_02 + 0x168) =
           effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           p_Var26;
      *(size_t *)(this_02 + 0x180) =
           effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
      effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      p_Var1 = &effects.delegateTargets._M_t._M_impl.super__Rb_tree_header;
      p_Var26 = effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var33 = effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      _Var29 = effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
      effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      effects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
    }
    *(_Base_ptr *)(this_02 + 0x170) = p_Var26;
    *(_Base_ptr *)(this_02 + 0x178) = p_Var33;
    *(undefined8 *)p_Var28 = 0;
    *(_Rb_tree_color *)(this_02 + 0x160) = _Var29;
    uVar31 = *(ulong *)(this_02 + 8);
    __n_01 = *(__node_ptr *)(original + 0xf);
    uVar30 = uVar31 % (ulong)__n_01;
    plVar36 = *(long **)(original[0xe].type.id + uVar30 * 8);
    if (plVar36 != (long *)0x0) {
      plVar36 = (long *)*plVar36;
      uVar32 = plVar36[1];
      do {
        if (uVar32 == uVar31) {
          std::__detail::
          _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<wasm::Expression_*const,_wasm::(anonymous_namespace)::Checker::ActiveOriginalInfo>,_false>_>_>
          ::_M_deallocate_node(this_02,__n_01);
          goto LAB_00775672;
        }
        plVar36 = (long *)*plVar36;
      } while ((plVar36 != (long *)0x0) && (uVar32 = plVar36[1], uVar32 % (ulong)__n_01 == uVar30));
    }
    auVar37 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&original[0x10].type,(ulong)__n_01,*(ulong *)(original + 0x10));
    __n_02 = auVar37._8_8_;
    if ((auVar37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __s = (Type *)(this_00->_M_h)._M_buckets;
    }
    else {
      if (__n_02 == 1) {
        __s = &original[0x11].type;
        original[0x11].type.id = 0;
      }
      else {
        __s = (Type *)__gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                                ((new_allocator<std::__detail::_Hash_node_base_*> *)&local_40,__n_02
                                 ,(void *)0x0);
        memset(__s,0,__n_02 * 8);
      }
      p_Var34 = (_Hash_node_base *)original[0xf].type.id;
      original[0xf].type.id = 0;
      if (p_Var34 != (_Hash_node_base *)0x0) {
        pTVar5 = &original[0xf].type;
        uVar30 = 0;
        do {
          p_Var13 = p_Var34->_M_nxt;
          uVar32 = (ulong)p_Var34[1]._M_nxt % __n_02;
          if ((_Hash_node_base *)__s[uVar32].id == (_Hash_node_base *)0x0) {
            p_Var34->_M_nxt = (_Hash_node_base *)pTVar5->id;
            pTVar5->id = (uintptr_t)p_Var34;
            __s[uVar32].id = (uintptr_t)pTVar5;
            if (p_Var34->_M_nxt != (_Hash_node_base *)0x0) {
              pTVar27 = __s + uVar30;
              goto LAB_007755ae;
            }
          }
          else {
            p_Var34->_M_nxt = ((_Hash_node_base *)__s[uVar32].id)->_M_nxt;
            pTVar27 = (Type *)__s[uVar32].id;
            uVar32 = uVar30;
LAB_007755ae:
            pTVar27->id = (uintptr_t)p_Var34;
          }
          p_Var34 = p_Var13;
          uVar30 = uVar32;
        } while (p_Var13 != (_Hash_node_base *)0x0);
      }
      puVar14 = (undefined1 *)original[0xe].type.id;
      if (&original[0x11].type != (Type *)puVar14) {
        operator_delete(puVar14,*(long *)(original + 0xf) << 3);
      }
      *(size_type *)(original + 0xf) = __n_02;
      original[0xe].type.id = (uintptr_t)__s;
      uVar30 = uVar31 % __n_02;
    }
    if ((_Hash_node_base *)__s[uVar30].id == (_Hash_node_base *)0x0) {
      uVar15 = original[0xf].type.id;
      *(uintptr_t *)&this_02->field_0x0 = uVar15;
      original[0xf].type.id = (uintptr_t)this_02;
      if (uVar15 != 0) {
        __s[*(ulong *)(uVar15 + 8) % *(ulong *)(original + 0xf)].id = (uintptr_t)this_02;
        __s = (Type *)original[0xe].type.id;
      }
      __s[uVar30].id = (uintptr_t)&original[0xf].type;
    }
    else {
      *(_Hash_node_base **)&this_02->field_0x0 = ((_Hash_node_base *)__s[uVar30].id)->_M_nxt;
      ((_Hash_node_base *)__s[uVar30].id)->_M_nxt = (_Hash_node_base *)this_02;
    }
    *(long *)(original + 0x10) = *(long *)(original + 0x10) + 1;
LAB_00775672:
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&effects.delegateTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&effects.breakTargets._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&effects.globalsWritten._M_t);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree(&effects.mutableGlobalsRead._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&effects.localsWritten._M_t);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&effects.localsRead._M_t);
    if (effects.funcEffectsMap.
        super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (effects.funcEffectsMap.
                 super___shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_208);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_238);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_290);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_2c0);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_2f0);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_320);
  if (invalidated.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               invalidated.
               super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
    // This is the first time we encounter this expression.
    assert(!activeOriginals.count(curr));

    // Given the current expression, see what it invalidates of the currently-
    // hashed expressions, if there are any.
    if (!activeOriginals.empty()) {
      EffectAnalyzer effects(options, *getModule());
      // We only need to visit this node itself, as we have already visited its
      // children by the time we get here.
      effects.visit(curr);

      std::vector<Expression*> invalidated;
      for (auto& kv : activeOriginals) {
        auto* original = kv.first;
        auto& originalInfo = kv.second;
        if (effects.invalidates(originalInfo.effects)) {
          invalidated.push_back(original);
        }
      }

      for (auto* original : invalidated) {
        // Remove all requests after this expression, as we cannot optimize to
        // them.
        requestInfos[original].requests -=
          activeOriginals.at(original).requestsLeft;

        // If no requests remain at all (that is, there were no requests we
        // could provide before we ran into this invalidation) then we do not
        // need this original at all.
        if (requestInfos[original].requests == 0) {
          requestInfos.erase(original);
        }

        activeOriginals.erase(original);
      }
    }

    auto iter = requestInfos.find(curr);
    if (iter == requestInfos.end()) {
      return;
    }
    auto& info = iter->second;
    info.validate();

    if (info.requests > 0) {
      // This is an original. Compute its side effects, as we cannot optimize
      // away repeated apperances if it has any.
      EffectAnalyzer effects(options, *getModule(), curr);

      // We can ignore traps here, as we replace a repeating expression with a
      // single appearance of it, a store to a local, and gets in the other
      // locations, and so if the expression traps then the first appearance -
      // that we keep around - would trap, and the others are never reached
      // anyhow. (The other checks we perform here, including invalidation and
      // determinism, will ensure that either all of the appearances trap, or
      // none of them.)
      effects.trap = false;

      // We also cannot optimize away something that is intrinsically
      // nondeterministic: even if it has no side effects, if it may return a
      // different result each time, then we cannot optimize away repeats.
      if (effects.hasSideEffects() ||
          Properties::isGenerative(curr, getModule()->features)) {
        requestInfos.erase(curr);
      } else {
        activeOriginals.emplace(
          curr, ActiveOriginalInfo{info.requests, std::move(effects)});
      }
    } else if (info.original) {
      // The original may have already been invalidated. If so, remove our info
      // as well.
      auto originalIter = activeOriginals.find(info.original);
      if (originalIter == activeOriginals.end()) {
        requestInfos.erase(iter);
        return;
      }

      // After visiting this expression, we have one less request for its
      // original, and perhaps none are left.
      auto& originalInfo = originalIter->second;
      if (originalInfo.requestsLeft == 1) {
        activeOriginals.erase(info.original);
      } else {
        originalInfo.requestsLeft--;
      }
    }
  }